

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

bool vkt::anon_unknown_0::logAndVerifyImages
               (TestLog *log,DeviceInterface *vk,VkDevice device,
               vector<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
               *attachmentResources,vector<bool,_std::allocator<bool>_> *attachmentIsLazy,
               RenderPass *renderPassInfo,
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               *renderPassClearValues,
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               *imageClearValues,
               vector<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
               *subpassRenderInfo,UVec2 *targetSize,TestConfig *config)

{
  undefined8 uVar1;
  byte bVar2;
  const_reference cVar3;
  bool bVar4;
  VkFormat VVar5;
  VkResult VVar6;
  uint uVar7;
  uint uVar8;
  VkAttachmentStoreOp VVar9;
  MessageBuilder *this;
  vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
  *pvVar10;
  size_type sVar11;
  const_reference pvVar12;
  const_reference pvVar13;
  AttachmentResources *pAVar14;
  Allocation *pAVar15;
  void *pvVar16;
  reference pvVar17;
  reference pvVar18;
  byte local_1829;
  byte local_17f1;
  byte local_17b1;
  byte local_1739;
  byte local_1719;
  ConstPixelBufferAccess local_1638;
  string local_1610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15f0;
  string local_15d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15b0;
  LogImage local_1590;
  PixelBufferAccess local_1500;
  ConstPixelBufferAccess local_14d8;
  string local_14b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1490;
  string local_1470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1450;
  LogImage local_1430;
  string local_13a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1380;
  string local_1360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1340;
  LogImage local_1320;
  TextureFormat local_1290;
  undefined1 local_1288 [8];
  TextureLevel errorImage_2;
  ConstPixelBufferAccess access_2;
  string local_1210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11f0;
  string local_11d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b0;
  LogImage local_1190;
  PixelBufferAccess local_1100;
  ConstPixelBufferAccess local_10d8;
  string local_10b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1090;
  string local_1070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1050;
  LogImage local_1030;
  string local_fa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f80;
  string local_f60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f40;
  LogImage local_f20;
  TextureFormat local_e90;
  undefined1 local_e88 [8];
  TextureLevel errorImage_1;
  ConstPixelBufferAccess access_1;
  string local_e10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df0;
  string local_dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db0;
  LogImage local_d90;
  PixelBufferAccess local_d00;
  ConstPixelBufferAccess local_cd8;
  string local_cb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90;
  string local_c70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c50;
  LogImage local_c30;
  string local_ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  string local_b60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b40;
  LogImage local_b20;
  TextureFormat local_a90;
  undefined1 local_a88 [8];
  TextureLevel errorImage;
  ConstPixelBufferAccess access;
  VkMappedMemoryRange range;
  void *ptr;
  VkDeviceSize bufferSize;
  string local_9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  string local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  LogImage local_958;
  PixelBufferAccess local_8c8;
  ConstPixelBufferAccess local_8a0;
  string local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  string local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  LogImage local_7f8;
  PixelBufferAccess local_768;
  ConstPixelBufferAccess local_740;
  string local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  string local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  LogImage local_698;
  string local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  string local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  LogImage local_548;
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  string local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  LogImage local_3f8;
  TextureFormat local_368;
  undefined1 local_360 [8];
  TextureLevel stencilErrorImage;
  undefined1 local_330 [8];
  TextureLevel depthErrorImage;
  ConstPixelBufferAccess stencilAccess;
  ConstPixelBufferAccess depthAccess;
  VkMappedMemoryRange ranges [2];
  void *stencilPtr;
  VkDeviceSize stencilBufferSize;
  TextureFormat stencilFormat;
  void *depthPtr;
  VkDeviceSize depthBufferSize;
  TextureFormat depthFormat;
  TextureFormat format;
  Attachment attachment;
  size_t attachmentNdx;
  MessageBuilder local_1f0;
  byte local_69;
  undefined1 local_68 [7];
  bool isOk;
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> referenceAttachments;
  vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  referenceValues;
  RenderPass *renderPassInfo_local;
  vector<bool,_std::allocator<bool>_> *attachmentIsLazy_local;
  vector<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
  *attachmentResources_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  TestLog *log_local;
  
  std::
  vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  ::vector((vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
            *)&referenceAttachments.
               super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::vector
            ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)local_68);
  local_69 = 1;
  tcu::TestLog::operator<<(&local_1f0,log,(BeginMessageToken *)&tcu::TestLog::Message);
  this = tcu::MessageBuilder::operator<<
                   (&local_1f0,
                    (char (*) [62])"Reference images fill undefined pixels with 3x3 grid pattern.");
  tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1f0);
  renderReferenceValues
            ((vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
              *)&referenceAttachments.
                 super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,renderPassInfo,targetSize,
             imageClearValues,renderPassClearValues,subpassRenderInfo,&config->renderPos,
             &config->renderSize);
  renderReferenceImagesFromValues
            ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)local_68,
             (vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
              *)&referenceAttachments.
                 super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,targetSize,renderPassInfo);
  attachment.m_initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  attachment.m_finalLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  do {
    uVar1 = attachment._24_8_;
    pvVar10 = RenderPass::getAttachments(renderPassInfo);
    sVar11 = std::
             vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
             ::size(pvVar10);
    bVar2 = local_69;
    if (sVar11 <= (ulong)uVar1) {
      std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::~vector
                ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)local_68);
      std::
      vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
      ::~vector((vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                 *)&referenceAttachments.
                    super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      return (bool)(bVar2 & 1);
    }
    cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](attachmentIsLazy,attachment._24_8_)
    ;
    if (!cVar3) {
      pvVar10 = RenderPass::getAttachments(renderPassInfo);
      pvVar12 = std::
                vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                ::operator[](pvVar10,attachment._24_8_);
      format.order = pvVar12->m_format;
      format.type = pvVar12->m_samples;
      attachment.m_format = pvVar12->m_loadOp;
      attachment.m_samples = pvVar12->m_storeOp;
      attachment.m_loadOp = pvVar12->m_stencilLoadOp;
      attachment.m_storeOp = pvVar12->m_stencilStoreOp;
      attachment.m_stencilLoadOp = pvVar12->m_initialLayout;
      attachment.m_stencilStoreOp = pvVar12->m_finalLayout;
      VVar5 = Attachment::getFormat((Attachment *)&format);
      depthFormat = ::vk::mapVkFormat(VVar5);
      bVar4 = tcu::hasDepthComponent(depthFormat.order);
      if (bVar4) {
        bVar4 = tcu::hasStencilComponent(depthFormat.order);
        if (bVar4) {
          VVar5 = Attachment::getFormat((Attachment *)&format);
          depthBufferSize = (VkDeviceSize)::vk::getDepthCopyFormat(VVar5);
          tcu::Vector<unsigned_int,_2>::x(targetSize);
          tcu::Vector<unsigned_int,_2>::y(targetSize);
          tcu::TextureFormat::getPixelSize((TextureFormat *)&depthBufferSize);
          pvVar13 = std::
                    vector<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                    ::operator[](attachmentResources,attachment._24_8_);
          pAVar14 = de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>::operator->
                              (pvVar13);
          pAVar15 = AttachmentResources::getResultMemory(pAVar14);
          stencilFormat = (TextureFormat)::vk::Allocation::getHostPtr(pAVar15);
          VVar5 = Attachment::getFormat((Attachment *)&format);
          stencilBufferSize = (VkDeviceSize)::vk::getStencilCopyFormat(VVar5);
          tcu::Vector<unsigned_int,_2>::x(targetSize);
          tcu::Vector<unsigned_int,_2>::y(targetSize);
          tcu::TextureFormat::getPixelSize((TextureFormat *)&stencilBufferSize);
          pvVar13 = std::
                    vector<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                    ::operator[](attachmentResources,attachment._24_8_);
          pAVar14 = de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>::operator->
                              (pvVar13);
          pAVar15 = AttachmentResources::getSecondaryResultMemory(pAVar14);
          pvVar16 = ::vk::Allocation::getHostPtr(pAVar15);
          depthAccess.m_data._0_4_ = 6;
          pvVar13 = std::
                    vector<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                    ::operator[](attachmentResources,attachment._24_8_);
          pAVar14 = de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>::operator->
                              (pvVar13);
          pAVar15 = AttachmentResources::getResultMemory(pAVar14);
          ::vk::Allocation::getMemory(pAVar15);
          pvVar13 = std::
                    vector<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                    ::operator[](attachmentResources,attachment._24_8_);
          pAVar14 = de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>::operator->
                              (pvVar13);
          pAVar15 = AttachmentResources::getResultMemory(pAVar14);
          ::vk::Allocation::getOffset(pAVar15);
          pvVar13 = std::
                    vector<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                    ::operator[](attachmentResources,attachment._24_8_);
          pAVar14 = de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>::operator->
                              (pvVar13);
          pAVar15 = AttachmentResources::getSecondaryResultMemory(pAVar14);
          ::vk::Allocation::getMemory(pAVar15);
          pvVar13 = std::
                    vector<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                    ::operator[](attachmentResources,attachment._24_8_);
          pAVar14 = de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>::operator->
                              (pvVar13);
          pAVar15 = AttachmentResources::getSecondaryResultMemory(pAVar14);
          ::vk::Allocation::getOffset(pAVar15);
          VVar6 = (*vk->_vptr_DeviceInterface[10])(vk,device,2,&depthAccess.m_data);
          ::vk::checkResult(VVar6,"vk.invalidateMappedMemoryRanges(device, 2u, ranges)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktRenderPassTests.cpp"
                            ,0xd35);
          uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
          uVar8 = tcu::Vector<unsigned_int,_2>::y(targetSize);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)&stencilAccess.m_data,
                     (TextureFormat *)&depthBufferSize,uVar7,uVar8,1,(void *)stencilFormat);
          uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
          uVar8 = tcu::Vector<unsigned_int,_2>::y(targetSize);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)&depthErrorImage.m_data.m_cap,
                     (TextureFormat *)&stencilBufferSize,uVar7,uVar8,1,pvVar16);
          tcu::TextureFormat::TextureFormat
                    ((TextureFormat *)&stencilErrorImage.m_data.m_cap,RGBA,UNORM_INT8);
          uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
          uVar8 = tcu::Vector<unsigned_int,_2>::y(targetSize);
          tcu::TextureLevel::TextureLevel
                    ((TextureLevel *)local_330,(TextureFormat *)&stencilErrorImage.m_data.m_cap,
                     uVar7,uVar8,1);
          tcu::TextureFormat::TextureFormat(&local_368,RGBA,UNORM_INT8);
          uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
          uVar8 = tcu::Vector<unsigned_int,_2>::y(targetSize);
          tcu::TextureLevel::TextureLevel((TextureLevel *)local_360,&local_368,uVar7,uVar8,1);
          de::toString<unsigned_long>(&local_458,(unsigned_long *)&attachment.m_initialLayout);
          std::operator+(&local_438,"Attachment",&local_458);
          std::operator+(&local_418,&local_438,"Depth");
          de::toString<unsigned_long>(&local_4b8,(unsigned_long *)&attachment.m_initialLayout);
          std::operator+(&local_498,"Attachment ",&local_4b8);
          std::operator+(&local_478,&local_498," Depth");
          tcu::LogImage::LogImage
                    (&local_3f8,&local_418,&local_478,
                     (ConstPixelBufferAccess *)&stencilAccess.m_data,QP_IMAGE_COMPRESSION_MODE_BEST)
          ;
          tcu::TestLog::operator<<(log,&local_3f8);
          tcu::LogImage::~LogImage(&local_3f8);
          std::__cxx11::string::~string((string *)&local_478);
          std::__cxx11::string::~string((string *)&local_498);
          std::__cxx11::string::~string((string *)&local_4b8);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::~string((string *)&local_458);
          de::toString<unsigned_long>(&local_5a8,(unsigned_long *)&attachment.m_initialLayout);
          std::operator+(&local_588,"Attachment",&local_5a8);
          std::operator+(&local_568,&local_588,"Stencil");
          de::toString<unsigned_long>(&local_608,(unsigned_long *)&attachment.m_initialLayout);
          std::operator+(&local_5e8,"Attachment ",&local_608);
          std::operator+(&local_5c8,&local_5e8," Stencil");
          tcu::LogImage::LogImage
                    (&local_548,&local_568,&local_5c8,
                     (ConstPixelBufferAccess *)&depthErrorImage.m_data.m_cap,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::TestLog::operator<<(log,&local_548);
          tcu::LogImage::~LogImage(&local_548);
          std::__cxx11::string::~string((string *)&local_5c8);
          std::__cxx11::string::~string((string *)&local_5e8);
          std::__cxx11::string::~string((string *)&local_608);
          std::__cxx11::string::~string((string *)&local_568);
          std::__cxx11::string::~string((string *)&local_588);
          std::__cxx11::string::~string((string *)&local_5a8);
          de::toString<unsigned_long>(&local_6d8,(unsigned_long *)&attachment.m_initialLayout);
          std::operator+(&local_6b8,"AttachmentReference",&local_6d8);
          de::toString<unsigned_long>(&local_718,(unsigned_long *)&attachment.m_initialLayout);
          std::operator+(&local_6f8,"Attachment reference ",&local_718);
          pvVar17 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::operator[]
                              ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)
                               local_68,attachment._24_8_);
          tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_740,pvVar17);
          tcu::LogImage::LogImage
                    (&local_698,&local_6b8,&local_6f8,&local_740,QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::TestLog::operator<<(log,&local_698);
          tcu::LogImage::~LogImage(&local_698);
          std::__cxx11::string::~string((string *)&local_6f8);
          std::__cxx11::string::~string((string *)&local_718);
          std::__cxx11::string::~string((string *)&local_6b8);
          std::__cxx11::string::~string((string *)&local_6d8);
          pvVar10 = RenderPass::getAttachments(renderPassInfo);
          pvVar12 = std::
                    vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                    ::operator[](pvVar10,attachment._24_8_);
          VVar9 = Attachment::getStoreOp(pvVar12);
          local_1719 = 0;
          if (VVar9 == VK_ATTACHMENT_STORE_OP_STORE) {
            pvVar18 = std::
                      vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                      ::operator[]((vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                                    *)&referenceAttachments.
                                       super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   attachment._24_8_);
            tcu::TextureLevel::getAccess(&local_768,(TextureLevel *)local_330);
            bVar4 = verifyDepthAttachment
                              (pvVar18,(ConstPixelBufferAccess *)&stencilAccess.m_data,&local_768);
            local_1719 = bVar4 ^ 0xff;
          }
          if ((local_1719 & 1) != 0) {
            de::toString<unsigned_long>(&local_838,(unsigned_long *)&attachment.m_initialLayout);
            std::operator+(&local_818,"DepthAttachmentError",&local_838);
            de::toString<unsigned_long>(&local_878,(unsigned_long *)&attachment.m_initialLayout);
            std::operator+(&local_858,"Depth Attachment Error ",&local_878);
            tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_8a0,(TextureLevel *)local_330);
            tcu::LogImage::LogImage
                      (&local_7f8,&local_818,&local_858,&local_8a0,QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::TestLog::operator<<(log,&local_7f8);
            tcu::LogImage::~LogImage(&local_7f8);
            std::__cxx11::string::~string((string *)&local_858);
            std::__cxx11::string::~string((string *)&local_878);
            std::__cxx11::string::~string((string *)&local_818);
            std::__cxx11::string::~string((string *)&local_838);
            local_69 = 0;
          }
          pvVar10 = RenderPass::getAttachments(renderPassInfo);
          pvVar12 = std::
                    vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                    ::operator[](pvVar10,attachment._24_8_);
          VVar9 = Attachment::getStencilStoreOp(pvVar12);
          local_1739 = 0;
          if (VVar9 == VK_ATTACHMENT_STORE_OP_STORE) {
            pvVar18 = std::
                      vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                      ::operator[]((vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                                    *)&referenceAttachments.
                                       super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   attachment._24_8_);
            tcu::TextureLevel::getAccess(&local_8c8,(TextureLevel *)local_360);
            bVar4 = verifyStencilAttachment
                              (pvVar18,(ConstPixelBufferAccess *)&depthErrorImage.m_data.m_cap,
                               &local_8c8);
            local_1739 = bVar4 ^ 0xff;
          }
          if ((local_1739 & 1) != 0) {
            de::toString<unsigned_long>(&local_998,(unsigned_long *)&attachment.m_initialLayout);
            std::operator+(&local_978,"StencilAttachmentError",&local_998);
            de::toString<unsigned_long>(&local_9d8,(unsigned_long *)&attachment.m_initialLayout);
            std::operator+(&local_9b8,"Stencil Attachment Error ",&local_9d8);
            tcu::TextureLevel::getAccess((PixelBufferAccess *)&bufferSize,(TextureLevel *)local_360)
            ;
            tcu::LogImage::LogImage
                      (&local_958,&local_978,&local_9b8,(ConstPixelBufferAccess *)&bufferSize,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::TestLog::operator<<(log,&local_958);
            tcu::LogImage::~LogImage(&local_958);
            std::__cxx11::string::~string((string *)&local_9b8);
            std::__cxx11::string::~string((string *)&local_9d8);
            std::__cxx11::string::~string((string *)&local_978);
            std::__cxx11::string::~string((string *)&local_998);
            local_69 = 0;
          }
          tcu::TextureLevel::~TextureLevel((TextureLevel *)local_360);
          tcu::TextureLevel::~TextureLevel((TextureLevel *)local_330);
          goto LAB_00752c9d;
        }
      }
      tcu::Vector<unsigned_int,_2>::x(targetSize);
      tcu::Vector<unsigned_int,_2>::y(targetSize);
      tcu::TextureFormat::getPixelSize(&depthFormat);
      pvVar13 = std::
                vector<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                ::operator[](attachmentResources,attachment._24_8_);
      pAVar14 = de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>::operator->(pvVar13);
      pAVar15 = AttachmentResources::getResultMemory(pAVar14);
      pvVar16 = ::vk::Allocation::getHostPtr(pAVar15);
      access.m_data._0_4_ = 6;
      pvVar13 = std::
                vector<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                ::operator[](attachmentResources,attachment._24_8_);
      pAVar14 = de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>::operator->(pvVar13);
      pAVar15 = AttachmentResources::getResultMemory(pAVar14);
      ::vk::Allocation::getMemory(pAVar15);
      pvVar13 = std::
                vector<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                ::operator[](attachmentResources,attachment._24_8_);
      pAVar14 = de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>::operator->(pvVar13);
      pAVar15 = AttachmentResources::getResultMemory(pAVar14);
      ::vk::Allocation::getOffset(pAVar15);
      VVar6 = (*vk->_vptr_DeviceInterface[10])(vk,device,1,&access.m_data);
      ::vk::checkResult(VVar6,"vk.invalidateMappedMemoryRanges(device, 1u, &range)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktRenderPassTests.cpp"
                        ,0xd5e);
      bVar4 = tcu::hasDepthComponent(depthFormat.order);
      if (bVar4) {
        uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
        uVar8 = tcu::Vector<unsigned_int,_2>::y(targetSize);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&errorImage.m_data.m_cap,&depthFormat,uVar7,uVar8,1,
                   pvVar16);
        tcu::TextureFormat::TextureFormat(&local_a90,RGBA,UNORM_INT8);
        uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
        uVar8 = tcu::Vector<unsigned_int,_2>::y(targetSize);
        tcu::TextureLevel::TextureLevel((TextureLevel *)local_a88,&local_a90,uVar7,uVar8,1);
        de::toString<unsigned_long>(&local_b60,(unsigned_long *)&attachment.m_initialLayout);
        std::operator+(&local_b40,"Attachment",&local_b60);
        de::toString<unsigned_long>(&local_ba0,(unsigned_long *)&attachment.m_initialLayout);
        std::operator+(&local_b80,"Attachment ",&local_ba0);
        tcu::LogImage::LogImage
                  (&local_b20,&local_b40,&local_b80,
                   (ConstPixelBufferAccess *)&errorImage.m_data.m_cap,QP_IMAGE_COMPRESSION_MODE_BEST
                  );
        tcu::TestLog::operator<<(log,&local_b20);
        tcu::LogImage::~LogImage(&local_b20);
        std::__cxx11::string::~string((string *)&local_b80);
        std::__cxx11::string::~string((string *)&local_ba0);
        std::__cxx11::string::~string((string *)&local_b40);
        std::__cxx11::string::~string((string *)&local_b60);
        de::toString<unsigned_long>(&local_c70,(unsigned_long *)&attachment.m_initialLayout);
        std::operator+(&local_c50,"AttachmentReference",&local_c70);
        de::toString<unsigned_long>(&local_cb0,(unsigned_long *)&attachment.m_initialLayout);
        std::operator+(&local_c90,"Attachment reference ",&local_cb0);
        pvVar17 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::operator[]
                            ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)
                             local_68,attachment._24_8_);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_cd8,pvVar17);
        tcu::LogImage::LogImage
                  (&local_c30,&local_c50,&local_c90,&local_cd8,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::TestLog::operator<<(log,&local_c30);
        tcu::LogImage::~LogImage(&local_c30);
        std::__cxx11::string::~string((string *)&local_c90);
        std::__cxx11::string::~string((string *)&local_cb0);
        std::__cxx11::string::~string((string *)&local_c50);
        std::__cxx11::string::~string((string *)&local_c70);
        pvVar10 = RenderPass::getAttachments(renderPassInfo);
        pvVar12 = std::
                  vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                  ::operator[](pvVar10,attachment._24_8_);
        VVar9 = Attachment::getStoreOp(pvVar12);
        if (VVar9 == VK_ATTACHMENT_STORE_OP_STORE) {
LAB_00751c1e:
          pvVar18 = std::
                    vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                    ::operator[]((vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                                  *)&referenceAttachments.
                                     super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 attachment._24_8_);
          tcu::TextureLevel::getAccess(&local_d00,(TextureLevel *)local_a88);
          bVar4 = verifyDepthAttachment
                            (pvVar18,(ConstPixelBufferAccess *)&errorImage.m_data.m_cap,&local_d00);
          local_17b1 = bVar4 ^ 0xff;
        }
        else {
          pvVar10 = RenderPass::getAttachments(renderPassInfo);
          pvVar12 = std::
                    vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                    ::operator[](pvVar10,attachment._24_8_);
          VVar9 = Attachment::getStencilStoreOp(pvVar12);
          local_17b1 = 0;
          if (VVar9 == VK_ATTACHMENT_STORE_OP_STORE) goto LAB_00751c1e;
        }
        if ((local_17b1 & 1) != 0) {
          de::toString<unsigned_long>(&local_dd0,(unsigned_long *)&attachment.m_initialLayout);
          std::operator+(&local_db0,"AttachmentError",&local_dd0);
          de::toString<unsigned_long>(&local_e10,(unsigned_long *)&attachment.m_initialLayout);
          std::operator+(&local_df0,"Attachment Error ",&local_e10);
          tcu::TextureLevel::getAccess
                    ((PixelBufferAccess *)&access_1.m_data,(TextureLevel *)local_a88);
          tcu::LogImage::LogImage
                    (&local_d90,&local_db0,&local_df0,(ConstPixelBufferAccess *)&access_1.m_data,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::TestLog::operator<<(log,&local_d90);
          tcu::LogImage::~LogImage(&local_d90);
          std::__cxx11::string::~string((string *)&local_df0);
          std::__cxx11::string::~string((string *)&local_e10);
          std::__cxx11::string::~string((string *)&local_db0);
          std::__cxx11::string::~string((string *)&local_dd0);
          local_69 = 0;
        }
        tcu::TextureLevel::~TextureLevel((TextureLevel *)local_a88);
      }
      else {
        bVar4 = tcu::hasStencilComponent(depthFormat.order);
        if (bVar4) {
          uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
          uVar8 = tcu::Vector<unsigned_int,_2>::y(targetSize);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)&errorImage_1.m_data.m_cap,&depthFormat,uVar7,uVar8,1
                     ,pvVar16);
          tcu::TextureFormat::TextureFormat(&local_e90,RGBA,UNORM_INT8);
          uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
          uVar8 = tcu::Vector<unsigned_int,_2>::y(targetSize);
          tcu::TextureLevel::TextureLevel((TextureLevel *)local_e88,&local_e90,uVar7,uVar8,1);
          de::toString<unsigned_long>(&local_f60,(unsigned_long *)&attachment.m_initialLayout);
          std::operator+(&local_f40,"Attachment",&local_f60);
          de::toString<unsigned_long>(&local_fa0,(unsigned_long *)&attachment.m_initialLayout);
          std::operator+(&local_f80,"Attachment ",&local_fa0);
          tcu::LogImage::LogImage
                    (&local_f20,&local_f40,&local_f80,
                     (ConstPixelBufferAccess *)&errorImage_1.m_data.m_cap,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::TestLog::operator<<(log,&local_f20);
          tcu::LogImage::~LogImage(&local_f20);
          std::__cxx11::string::~string((string *)&local_f80);
          std::__cxx11::string::~string((string *)&local_fa0);
          std::__cxx11::string::~string((string *)&local_f40);
          std::__cxx11::string::~string((string *)&local_f60);
          de::toString<unsigned_long>(&local_1070,(unsigned_long *)&attachment.m_initialLayout);
          std::operator+(&local_1050,"AttachmentReference",&local_1070);
          de::toString<unsigned_long>(&local_10b0,(unsigned_long *)&attachment.m_initialLayout);
          std::operator+(&local_1090,"Attachment reference ",&local_10b0);
          pvVar17 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::operator[]
                              ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)
                               local_68,attachment._24_8_);
          tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_10d8,pvVar17);
          tcu::LogImage::LogImage
                    (&local_1030,&local_1050,&local_1090,&local_10d8,QP_IMAGE_COMPRESSION_MODE_BEST)
          ;
          tcu::TestLog::operator<<(log,&local_1030);
          tcu::LogImage::~LogImage(&local_1030);
          std::__cxx11::string::~string((string *)&local_1090);
          std::__cxx11::string::~string((string *)&local_10b0);
          std::__cxx11::string::~string((string *)&local_1050);
          std::__cxx11::string::~string((string *)&local_1070);
          pvVar10 = RenderPass::getAttachments(renderPassInfo);
          pvVar12 = std::
                    vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                    ::operator[](pvVar10,attachment._24_8_);
          VVar9 = Attachment::getStoreOp(pvVar12);
          if (VVar9 == VK_ATTACHMENT_STORE_OP_STORE) {
LAB_007522a7:
            pvVar18 = std::
                      vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                      ::operator[]((vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                                    *)&referenceAttachments.
                                       super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   attachment._24_8_);
            tcu::TextureLevel::getAccess(&local_1100,(TextureLevel *)local_e88);
            bVar4 = verifyStencilAttachment
                              (pvVar18,(ConstPixelBufferAccess *)&errorImage_1.m_data.m_cap,
                               &local_1100);
            local_17f1 = bVar4 ^ 0xff;
          }
          else {
            pvVar10 = RenderPass::getAttachments(renderPassInfo);
            pvVar12 = std::
                      vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                      ::operator[](pvVar10,attachment._24_8_);
            VVar9 = Attachment::getStencilStoreOp(pvVar12);
            local_17f1 = 0;
            if (VVar9 == VK_ATTACHMENT_STORE_OP_STORE) goto LAB_007522a7;
          }
          if ((local_17f1 & 1) != 0) {
            de::toString<unsigned_long>(&local_11d0,(unsigned_long *)&attachment.m_initialLayout);
            std::operator+(&local_11b0,"AttachmentError",&local_11d0);
            de::toString<unsigned_long>(&local_1210,(unsigned_long *)&attachment.m_initialLayout);
            std::operator+(&local_11f0,"Attachment Error ",&local_1210);
            tcu::TextureLevel::getAccess
                      ((PixelBufferAccess *)&access_2.m_data,(TextureLevel *)local_e88);
            tcu::LogImage::LogImage
                      (&local_1190,&local_11b0,&local_11f0,
                       (ConstPixelBufferAccess *)&access_2.m_data,QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::TestLog::operator<<(log,&local_1190);
            tcu::LogImage::~LogImage(&local_1190);
            std::__cxx11::string::~string((string *)&local_11f0);
            std::__cxx11::string::~string((string *)&local_1210);
            std::__cxx11::string::~string((string *)&local_11b0);
            std::__cxx11::string::~string((string *)&local_11d0);
            local_69 = 0;
          }
          tcu::TextureLevel::~TextureLevel((TextureLevel *)local_e88);
          goto LAB_00752c9d;
        }
        uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
        uVar8 = tcu::Vector<unsigned_int,_2>::y(targetSize);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&errorImage_2.m_data.m_cap,&depthFormat,uVar7,uVar8,1,
                   pvVar16);
        tcu::TextureFormat::TextureFormat(&local_1290,RGBA,UNORM_INT8);
        uVar7 = tcu::Vector<unsigned_int,_2>::x(targetSize);
        uVar8 = tcu::Vector<unsigned_int,_2>::y(targetSize);
        tcu::TextureLevel::TextureLevel((TextureLevel *)local_1288,&local_1290,uVar7,uVar8,1);
        de::toString<unsigned_long>(&local_1360,(unsigned_long *)&attachment.m_initialLayout);
        std::operator+(&local_1340,"Attachment",&local_1360);
        de::toString<unsigned_long>(&local_13a0,(unsigned_long *)&attachment.m_initialLayout);
        std::operator+(&local_1380,"Attachment ",&local_13a0);
        tcu::LogImage::LogImage
                  (&local_1320,&local_1340,&local_1380,
                   (ConstPixelBufferAccess *)&errorImage_2.m_data.m_cap,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::TestLog::operator<<(log,&local_1320);
        tcu::LogImage::~LogImage(&local_1320);
        std::__cxx11::string::~string((string *)&local_1380);
        std::__cxx11::string::~string((string *)&local_13a0);
        std::__cxx11::string::~string((string *)&local_1340);
        std::__cxx11::string::~string((string *)&local_1360);
        de::toString<unsigned_long>(&local_1470,(unsigned_long *)&attachment.m_initialLayout);
        std::operator+(&local_1450,"AttachmentReference",&local_1470);
        de::toString<unsigned_long>(&local_14b0,(unsigned_long *)&attachment.m_initialLayout);
        std::operator+(&local_1490,"Attachment reference ",&local_14b0);
        pvVar17 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::operator[]
                            ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)
                             local_68,attachment._24_8_);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_14d8,pvVar17);
        tcu::LogImage::LogImage
                  (&local_1430,&local_1450,&local_1490,&local_14d8,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::TestLog::operator<<(log,&local_1430);
        tcu::LogImage::~LogImage(&local_1430);
        std::__cxx11::string::~string((string *)&local_1490);
        std::__cxx11::string::~string((string *)&local_14b0);
        std::__cxx11::string::~string((string *)&local_1450);
        std::__cxx11::string::~string((string *)&local_1470);
        pvVar10 = RenderPass::getAttachments(renderPassInfo);
        pvVar12 = std::
                  vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                  ::operator[](pvVar10,attachment._24_8_);
        VVar9 = Attachment::getStoreOp(pvVar12);
        if (VVar9 == VK_ATTACHMENT_STORE_OP_STORE) {
LAB_0075290e:
          pvVar18 = std::
                    vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                    ::operator[]((vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                                  *)&referenceAttachments.
                                     super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 attachment._24_8_);
          tcu::TextureLevel::getAccess(&local_1500,(TextureLevel *)local_1288);
          bVar4 = verifyColorAttachment
                            (pvVar18,(ConstPixelBufferAccess *)&errorImage_2.m_data.m_cap,
                             &local_1500);
          local_1829 = bVar4 ^ 0xff;
        }
        else {
          pvVar10 = RenderPass::getAttachments(renderPassInfo);
          pvVar12 = std::
                    vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                    ::operator[](pvVar10,attachment._24_8_);
          VVar9 = Attachment::getStencilStoreOp(pvVar12);
          local_1829 = 0;
          if (VVar9 == VK_ATTACHMENT_STORE_OP_STORE) goto LAB_0075290e;
        }
        if ((local_1829 & 1) != 0) {
          de::toString<unsigned_long>(&local_15d0,(unsigned_long *)&attachment.m_initialLayout);
          std::operator+(&local_15b0,"AttachmentError",&local_15d0);
          de::toString<unsigned_long>(&local_1610,(unsigned_long *)&attachment.m_initialLayout);
          std::operator+(&local_15f0,"Attachment Error ",&local_1610);
          tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_1638,(TextureLevel *)local_1288);
          tcu::LogImage::LogImage
                    (&local_1590,&local_15b0,&local_15f0,&local_1638,QP_IMAGE_COMPRESSION_MODE_BEST)
          ;
          tcu::TestLog::operator<<(log,&local_1590);
          tcu::LogImage::~LogImage(&local_1590);
          std::__cxx11::string::~string((string *)&local_15f0);
          std::__cxx11::string::~string((string *)&local_1610);
          std::__cxx11::string::~string((string *)&local_15b0);
          std::__cxx11::string::~string((string *)&local_15d0);
          local_69 = 0;
        }
        tcu::TextureLevel::~TextureLevel((TextureLevel *)local_1288);
      }
    }
LAB_00752c9d:
    attachment._24_8_ = attachment._24_8_ + 1;
  } while( true );
}

Assistant:

bool logAndVerifyImages (TestLog&											log,
						 const DeviceInterface&								vk,
						 VkDevice											device,
						 const vector<de::SharedPtr<AttachmentResources> >&	attachmentResources,
						 const vector<bool>&								attachmentIsLazy,
						 const RenderPass&									renderPassInfo,
						 const vector<Maybe<VkClearValue> >&				renderPassClearValues,
						 const vector<Maybe<VkClearValue> >&				imageClearValues,
						 const vector<SubpassRenderInfo>&					subpassRenderInfo,
						 const UVec2&										targetSize,
						 const TestConfig&									config)
{
	vector<vector<PixelValue> >	referenceValues;
	vector<tcu::TextureLevel>	referenceAttachments;
	bool						isOk					= true;

	log << TestLog::Message << "Reference images fill undefined pixels with 3x3 grid pattern." << TestLog::EndMessage;

	renderReferenceValues(referenceValues, renderPassInfo, targetSize, imageClearValues, renderPassClearValues, subpassRenderInfo, config.renderPos, config.renderSize);
	renderReferenceImagesFromValues(referenceAttachments, referenceValues, targetSize, renderPassInfo);

	for (size_t attachmentNdx = 0; attachmentNdx < renderPassInfo.getAttachments().size(); attachmentNdx++)
	{
		if (!attachmentIsLazy[attachmentNdx])
		{
			const Attachment			attachment		= renderPassInfo.getAttachments()[attachmentNdx];
			const tcu::TextureFormat	format			= mapVkFormat(attachment.getFormat());

			if (tcu::hasDepthComponent(format.order) && tcu::hasStencilComponent(format.order))
			{
				const tcu::TextureFormat	depthFormat			= getDepthCopyFormat(attachment.getFormat());
				const VkDeviceSize			depthBufferSize		= targetSize.x() * targetSize.y() * depthFormat.getPixelSize();
				void* const					depthPtr			= attachmentResources[attachmentNdx]->getResultMemory().getHostPtr();

				const tcu::TextureFormat	stencilFormat		= getStencilCopyFormat(attachment.getFormat());
				const VkDeviceSize			stencilBufferSize	= targetSize.x() * targetSize.y() * stencilFormat.getPixelSize();
				void* const					stencilPtr			= attachmentResources[attachmentNdx]->getSecondaryResultMemory().getHostPtr();

				const VkMappedMemoryRange	ranges[]			=
				{
					{
						VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,								// sType;
						DE_NULL,															// pNext;
						attachmentResources[attachmentNdx]->getResultMemory().getMemory(),	// mem;
						attachmentResources[attachmentNdx]->getResultMemory().getOffset(),	// offset;
						depthBufferSize														// size;
					},
					{
						VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,										// sType;
						DE_NULL,																	// pNext;
						attachmentResources[attachmentNdx]->getSecondaryResultMemory().getMemory(),	// mem;
						attachmentResources[attachmentNdx]->getSecondaryResultMemory().getOffset(),	// offset;
						stencilBufferSize															// size;
					}
				};
				VK_CHECK(vk.invalidateMappedMemoryRanges(device, 2u, ranges));

				{
					const ConstPixelBufferAccess	depthAccess			(depthFormat, targetSize.x(), targetSize.y(), 1, depthPtr);
					const ConstPixelBufferAccess	stencilAccess		(stencilFormat, targetSize.x(), targetSize.y(), 1, stencilPtr);
					tcu::TextureLevel				depthErrorImage		(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());
					tcu::TextureLevel				stencilErrorImage	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());

					log << TestLog::Image("Attachment" + de::toString(attachmentNdx) + "Depth", "Attachment " + de::toString(attachmentNdx) + " Depth", depthAccess);
					log << TestLog::Image("Attachment" + de::toString(attachmentNdx) + "Stencil", "Attachment " + de::toString(attachmentNdx) + " Stencil", stencilAccess);

					log << TestLog::Image("AttachmentReference" + de::toString(attachmentNdx), "Attachment reference " + de::toString(attachmentNdx), referenceAttachments[attachmentNdx].getAccess());

					if (renderPassInfo.getAttachments()[attachmentNdx].getStoreOp() == VK_ATTACHMENT_STORE_OP_STORE
						&& !verifyDepthAttachment(referenceValues[attachmentNdx], depthAccess, depthErrorImage.getAccess()))
					{
						log << TestLog::Image("DepthAttachmentError" + de::toString(attachmentNdx), "Depth Attachment Error " + de::toString(attachmentNdx), depthErrorImage.getAccess());
						isOk = false;
					}

					if (renderPassInfo.getAttachments()[attachmentNdx].getStencilStoreOp() == VK_ATTACHMENT_STORE_OP_STORE
						&& !verifyStencilAttachment(referenceValues[attachmentNdx], stencilAccess, stencilErrorImage.getAccess()))
					{
						log << TestLog::Image("StencilAttachmentError" + de::toString(attachmentNdx), "Stencil Attachment Error " + de::toString(attachmentNdx), stencilErrorImage.getAccess());
						isOk = false;
					}
				}
			}
			else
			{
				const VkDeviceSize			bufferSize	= targetSize.x() * targetSize.y() * format.getPixelSize();
				void* const					ptr			= attachmentResources[attachmentNdx]->getResultMemory().getHostPtr();

				const VkMappedMemoryRange	range		=
				{
					VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,								// sType;
					DE_NULL,															// pNext;
					attachmentResources[attachmentNdx]->getResultMemory().getMemory(),	// mem;
					attachmentResources[attachmentNdx]->getResultMemory().getOffset(),	// offset;
					bufferSize															// size;
				};
				VK_CHECK(vk.invalidateMappedMemoryRanges(device, 1u, &range));

				if (tcu::hasDepthComponent(format.order))
				{
					const ConstPixelBufferAccess	access		(format, targetSize.x(), targetSize.y(), 1, ptr);
					tcu::TextureLevel				errorImage	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());

					log << TestLog::Image("Attachment" + de::toString(attachmentNdx), "Attachment " + de::toString(attachmentNdx), access);
					log << TestLog::Image("AttachmentReference" + de::toString(attachmentNdx), "Attachment reference " + de::toString(attachmentNdx), referenceAttachments[attachmentNdx].getAccess());

					if ((renderPassInfo.getAttachments()[attachmentNdx].getStoreOp() == VK_ATTACHMENT_STORE_OP_STORE || renderPassInfo.getAttachments()[attachmentNdx].getStencilStoreOp() == VK_ATTACHMENT_STORE_OP_STORE)
						&& !verifyDepthAttachment(referenceValues[attachmentNdx], access, errorImage.getAccess()))
					{
						log << TestLog::Image("AttachmentError" + de::toString(attachmentNdx), "Attachment Error " + de::toString(attachmentNdx), errorImage.getAccess());
						isOk = false;
					}
				}
				else if (tcu::hasStencilComponent(format.order))
				{
					const ConstPixelBufferAccess	access		(format, targetSize.x(), targetSize.y(), 1, ptr);
					tcu::TextureLevel				errorImage	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());

					log << TestLog::Image("Attachment" + de::toString(attachmentNdx), "Attachment " + de::toString(attachmentNdx), access);
					log << TestLog::Image("AttachmentReference" + de::toString(attachmentNdx), "Attachment reference " + de::toString(attachmentNdx), referenceAttachments[attachmentNdx].getAccess());

					if ((renderPassInfo.getAttachments()[attachmentNdx].getStoreOp() == VK_ATTACHMENT_STORE_OP_STORE || renderPassInfo.getAttachments()[attachmentNdx].getStencilStoreOp() == VK_ATTACHMENT_STORE_OP_STORE)
						&& !verifyStencilAttachment(referenceValues[attachmentNdx], access, errorImage.getAccess()))
					{
						log << TestLog::Image("AttachmentError" + de::toString(attachmentNdx), "Attachment Error " + de::toString(attachmentNdx), errorImage.getAccess());
						isOk = false;
					}
				}
				else
				{
					const ConstPixelBufferAccess	access		(format, targetSize.x(), targetSize.y(), 1, ptr);
					tcu::TextureLevel				errorImage	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());

					log << TestLog::Image("Attachment" + de::toString(attachmentNdx), "Attachment " + de::toString(attachmentNdx), access);
					log << TestLog::Image("AttachmentReference" + de::toString(attachmentNdx), "Attachment reference " + de::toString(attachmentNdx), referenceAttachments[attachmentNdx].getAccess());

					if ((renderPassInfo.getAttachments()[attachmentNdx].getStoreOp() == VK_ATTACHMENT_STORE_OP_STORE || renderPassInfo.getAttachments()[attachmentNdx].getStencilStoreOp() == VK_ATTACHMENT_STORE_OP_STORE)
						&& !verifyColorAttachment(referenceValues[attachmentNdx], access, errorImage.getAccess()))
					{
						log << TestLog::Image("AttachmentError" + de::toString(attachmentNdx), "Attachment Error " + de::toString(attachmentNdx), errorImage.getAccess());
						isOk = false;
					}
				}
			}
		}
	}

	return isOk;
}